

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.cc
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::AddWeak
          (RepeatedPtrFieldBase *this,MessageLite *prototype)

{
  int iVar1;
  __int_type_conflict2 _Var2;
  int *piVar3;
  long *in_RSI;
  ArenaImpl *in_RDI;
  MessageLite *result;
  size_t n;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  ImplicitWeakMessage *in_stack_ffffffffffffff50;
  __pointer_type ptr;
  __pointer_type allocated_type;
  Arena *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  ImplicitWeakMessage *local_70;
  
  if (((in_RDI->space_allocated_).super___atomic_base<unsigned_long>._M_i == 0) ||
     (*(int *)(in_RDI->space_allocated_).super___atomic_base<unsigned_long>._M_i <=
      *(int *)&(in_RDI->hint_)._M_b._M_p)) {
    if (((in_RDI->space_allocated_).super___atomic_base<unsigned_long>._M_i == 0) ||
       (*(int *)(in_RDI->space_allocated_).super___atomic_base<unsigned_long>._M_i ==
        *(int *)((long)&(in_RDI->hint_)._M_b._M_p + 4))) {
      Reserve((RepeatedPtrFieldBase *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    }
    piVar3 = (int *)(in_RDI->space_allocated_).super___atomic_base<unsigned_long>._M_i;
    *piVar3 = *piVar3 + 1;
    if (in_RSI == (long *)0x0) {
      ptr = (in_RDI->threads_)._M_b._M_p;
      if (ptr == (__pointer_type)0x0) {
        local_70 = (ImplicitWeakMessage *)operator_new(0x30);
        ImplicitWeakMessage::ImplicitWeakMessage(in_stack_ffffffffffffff50);
      }
      else {
        allocated_type = ptr;
        AlignUpTo8(0x30);
        Arena::AllocHook(in_stack_ffffffffffffff60,(type_info *)allocated_type,(size_t)ptr);
        ArenaImpl::AllocateAlignedAndAddCleanup
                  (in_RDI,in_stack_ffffffffffffff68,(_func_void_void_ptr *)in_stack_ffffffffffffff60
                  );
        local_70 = Arena::InternalHelper<google::protobuf::internal::ImplicitWeakMessage>::
                   Construct<google::protobuf::Arena*>
                             (ptr,(Arena **)
                                  CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      }
    }
    else {
      local_70 = (ImplicitWeakMessage *)
                 (**(code **)(*in_RSI + 0x20))(in_RSI,(in_RDI->threads_)._M_b._M_p);
    }
    _Var2 = (in_RDI->space_allocated_).super___atomic_base<unsigned_long>._M_i;
    iVar1 = *(int *)&(in_RDI->hint_)._M_b._M_p;
    *(int *)&(in_RDI->hint_)._M_b._M_p = iVar1 + 1;
    *(ImplicitWeakMessage **)(_Var2 + 8 + (long)iVar1 * 8) = local_70;
  }
  else {
    _Var2 = (in_RDI->space_allocated_).super___atomic_base<unsigned_long>._M_i;
    iVar1 = *(int *)&(in_RDI->hint_)._M_b._M_p;
    *(int *)&(in_RDI->hint_)._M_b._M_p = iVar1 + 1;
    local_70 = *(ImplicitWeakMessage **)(_Var2 + 8 + (long)iVar1 * 8);
  }
  return &local_70->super_MessageLite;
}

Assistant:

MessageLite* RepeatedPtrFieldBase::AddWeak(const MessageLite* prototype) {
  if (rep_ != NULL && current_size_ < rep_->allocated_size) {
    return reinterpret_cast<MessageLite*>(rep_->elements[current_size_++]);
  }
  if (!rep_ || rep_->allocated_size == total_size_) {
    Reserve(total_size_ + 1);
  }
  ++rep_->allocated_size;
  MessageLite* result = prototype
                            ? prototype->New(arena_)
                            : Arena::CreateMessage<ImplicitWeakMessage>(arena_);
  rep_->elements[current_size_++] = result;
  return result;
}